

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O0

void storeRGBA16FFromRGBA32F_avx2
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  QRgbaFloat32 *pQVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  QRgbaFloat32 local_198;
  int local_17c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  __m128 vsr;
  float fStack_70;
  float fStack_6c;
  undefined8 uStack_68;
  float a;
  __m128 vsa;
  __m128 vsf;
  int i;
  __m128 zero;
  __m128 *s;
  quint64 *d;
  QDitherInfo *param_5_local;
  
  vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar8 = ZEXT816(0);
  for (local_17c = 0; local_17c < count; local_17c = local_17c + 1) {
    vpcmpeqd_avx(auVar8,auVar8);
    pQVar7 = src + local_17c;
    uVar1 = pQVar7->r;
    uVar2 = pQVar7->g;
    uVar3 = pQVar7->b;
    uVar4 = pQVar7->a;
    local_198 = *pQVar7;
    local_1a8 = CONCAT44(uVar4,uVar4);
    uStack_1a0._0_4_ = uVar4;
    uStack_1a0._4_4_ = uVar4;
    if (((float)uVar4 != 1.0) || (NAN((float)uVar4))) {
      if (((float)uVar4 != 0.0) || (NAN((float)uVar4))) {
        vpcmpeqd_avx(ZEXT416((uint)uVar4),ZEXT416((uint)uVar4));
        auVar6._8_8_ = uStack_1a0;
        auVar6._0_8_ = local_1a8;
        auVar8 = vrcpps_avx(auVar6);
        vsr[2] = auVar8._0_4_;
        vsr[3] = auVar8._4_4_;
        fStack_70 = auVar8._8_4_;
        fStack_6c = auVar8._12_4_;
        auVar5._4_4_ = vsr[3] + vsr[3];
        auVar5._0_4_ = vsr[2] + vsr[2];
        auVar5._8_4_ = fStack_70 + fStack_70;
        auVar5._12_4_ = fStack_6c + fStack_6c;
        auVar8._4_4_ = vsr[3] * vsr[3] * (float)uVar4;
        auVar8._0_4_ = vsr[2] * vsr[2] * (float)uVar4;
        auVar8._8_4_ = fStack_70 * fStack_70 * (float)uVar4;
        auVar8._12_4_ = fStack_6c * fStack_6c * (float)uVar4;
        auVar8 = vsubps_avx(auVar5,auVar8);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
        local_108 = auVar8._0_4_;
        fStack_104 = auVar8._4_4_;
        fStack_100 = auVar8._8_4_;
        fStack_fc = auVar8._12_4_;
        local_198.g = (float)uVar2 * fStack_104;
        local_198.r = (float)uVar1 * local_108;
        local_198.b = (float)uVar3 * fStack_100;
        local_198.a = (float)uVar4 * fStack_fc;
      }
      else {
        local_198 = (QRgbaFloat32)ZEXT816(0);
      }
    }
    auVar8 = vcvtps2ph_f16c((undefined1  [16])local_198,0);
    uStack_68 = auVar8._0_8_;
    *(undefined8 *)(dest + (long)local_17c * 8 + (long)index * 8) = uStack_68;
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBA16FFromRGBA32F_avx2(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    quint64 *d = reinterpret_cast<quint64 *>(dest) + index;
    const __m128 *s = reinterpret_cast<const __m128 *>(src);
    const __m128 zero = _mm_set1_ps(0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_loadu_ps(reinterpret_cast<const float *>(s + i));
        const __m128 vsa = _mm_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsr = _mm_insert_ps(vsr, _mm_set_ss(1.0f), 0x30);
            vsf = _mm_mul_ps(vsf, vsr);
        }
        _mm_storel_epi64((__m128i *)(d + i), _mm_cvtps_ph(vsf, 0));
    }
}